

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationGroup.cpp
# Opt level: O2

Pair<Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::BasicStringView<const_char>_>
* __thiscall
Corrade::Utility::ConfigurationGroup::ValueIterator::operator*
          (Pair<Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::BasicStringView<const_char>_>
           *__return_storage_ptr__,ValueIterator *this)

{
  char *local_28;
  size_t sStack_20;
  
  Containers::BasicStringView<char_const>::
  BasicStringView<std::__cxx11::string_const&,Corrade::Containers::BasicStringView<char_const>>
            ((BasicStringView<char_const> *)&local_28,&this->_value->key);
  Containers::BasicStringView<char_const>::
  BasicStringView<std::__cxx11::string_const&,Corrade::Containers::BasicStringView<char_const>>
            ((BasicStringView<char_const> *)&__return_storage_ptr__->_second,&this->_value->value);
  (__return_storage_ptr__->_first)._data = local_28;
  (__return_storage_ptr__->_first)._sizePlusFlags = sStack_20;
  return __return_storage_ptr__;
}

Assistant:

Containers::Pair<Containers::StringView, Containers::StringView> ConfigurationGroup::ValueIterator::operator*() const {
    return {_value->key, _value->value};
}